

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<cv::Mat>,testing::Matcher<cv::Rect_<int>>>,std::tuple<cv::Mat,cv::Rect_<int>>>
               (tuple<testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_> *matcher_tuple,
               tuple<cv::Mat,_cv::Rect_<int>_> *value_tuple)

{
  bool bVar1;
  MatcherBase<cv::Rect_<int>_> *this;
  __tuple_element_t<1UL,_tuple<Mat,_Rect_<int>_>_> *r;
  bool local_29;
  Rect_<int> local_28;
  tuple<cv::Mat,_cv::Rect_<int>_> *local_18;
  tuple<cv::Mat,_cv::Rect_<int>_> *value_tuple_local;
  tuple<testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_> *matcher_tuple_local;
  
  local_18 = value_tuple;
  value_tuple_local = (tuple<cv::Mat,_cv::Rect_<int>_> *)matcher_tuple;
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<cv::Mat>,testing::Matcher<cv::Rect_<int>>>,std::tuple<cv::Mat,cv::Rect_<int>>>
                    (matcher_tuple,value_tuple);
  local_29 = false;
  if (bVar1) {
    this = &std::get<1ul,testing::Matcher<cv::Mat>,testing::Matcher<cv::Rect_<int>>>
                      ((tuple<testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_> *)
                       value_tuple_local)->super_MatcherBase<cv::Rect_<int>_>;
    r = std::get<1ul,cv::Mat,cv::Rect_<int>>(local_18);
    cv::Rect_<int>::Rect_(&local_28,r);
    local_29 = MatcherBase<cv::Rect_<int>_>::Matches(this,&local_28);
  }
  return local_29;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }